

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

void Abc_CollectTopOr(Abc_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  int iVar1;
  void **ppvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  vSuper->nSize = 0;
  if (((ulong)pObj & 1) == 0) {
    if (vSuper->nCap == 0) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar2;
      vSuper->nCap = 0x10;
    }
    iVar1 = vSuper->nSize;
    vSuper->nSize = iVar1 + 1;
    vSuper->pArray[iVar1] = (void *)((ulong)pObj | 1);
  }
  else {
    Abc_CollectTopOr_rec((Abc_Obj_t *)((ulong)pObj & 0xfffffffffffffffe),vSuper);
    if (1 < (long)vSuper->nSize) {
      qsort(vSuper->pArray,(long)vSuper->nSize,8,Abc_ObjCompareById);
      iVar1 = vSuper->nSize;
      iVar3 = 1;
      if (1 < (long)iVar1) {
        lVar4 = 1;
        do {
          ppvVar2 = vSuper->pArray;
          if (ppvVar2[lVar4] != ppvVar2[lVar4 + -1]) {
            lVar5 = (long)iVar3;
            iVar3 = iVar3 + 1;
            ppvVar2[lVar5] = ppvVar2[lVar4];
          }
          lVar4 = lVar4 + 1;
        } while (iVar1 != lVar4);
      }
      vSuper->nSize = iVar3;
    }
  }
  return;
}

Assistant:

void Abc_CollectTopOr( Abc_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    Vec_PtrClear( vSuper );
    if ( Abc_ObjIsComplement(pObj) )
    {
        Abc_CollectTopOr_rec( Abc_ObjNot(pObj), vSuper );
        Vec_PtrUniqify( vSuper, (int (*)())Abc_ObjCompareById );
    }
    else
        Vec_PtrPush( vSuper, Abc_ObjNot(pObj) );
}